

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O2

bool __thiscall
cmGlobalNinjaGenerator::CheckLanguages
          (cmGlobalNinjaGenerator *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *languages,cmMakefile *mf)

{
  bool bVar1;
  string *psVar2;
  long lVar3;
  bool bVar4;
  allocator<char> local_61;
  string local_60;
  string architectures;
  
  bVar1 = ::cm::
          contains<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_char[8],_0>
                    (languages,(char (*) [8])0x659182);
  if (bVar1) {
    bVar1 = CheckFortran(this,mf);
    return bVar1;
  }
  bVar1 = ::cm::
          contains<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_char[5],_0>
                    (languages,(char (*) [5])"ISPC");
  if (bVar1) {
    bVar1 = CheckISPC(this,mf);
    return bVar1;
  }
  bVar1 = ::cm::
          contains<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_char[6],_0>
                    (languages,(char (*) [6])0x63e1cd);
  bVar4 = true;
  if (bVar1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_60,"CMAKE_OSX_ARCHITECTURES",&local_61);
    psVar2 = cmMakefile::GetSafeDefinition(mf,&local_60);
    std::__cxx11::string::string((string *)&architectures,(string *)psVar2);
    std::__cxx11::string::~string((string *)&local_60);
    lVar3 = std::__cxx11::string::find((char)&architectures,0x3b);
    if (lVar3 == -1) {
      std::__cxx11::string::~string((string *)&architectures);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_60,
                 "multiple values for CMAKE_OSX_ARCHITECTURES not supported with Swift",&local_61);
      cmMakefile::IssueMessage(mf,FATAL_ERROR,&local_60);
      std::__cxx11::string::~string((string *)&local_60);
      cmSystemTools::s_FatalErrorOccurred = true;
      std::__cxx11::string::~string((string *)&architectures);
      bVar4 = false;
    }
  }
  return bVar4;
}

Assistant:

bool cmGlobalNinjaGenerator::CheckLanguages(
  std::vector<std::string> const& languages, cmMakefile* mf) const
{
  if (cm::contains(languages, "Fortran")) {
    return this->CheckFortran(mf);
  }
  if (cm::contains(languages, "ISPC")) {
    return this->CheckISPC(mf);
  }
  if (cm::contains(languages, "Swift")) {
    const std::string architectures =
      mf->GetSafeDefinition("CMAKE_OSX_ARCHITECTURES");
    if (architectures.find_first_of(';') != std::string::npos) {
      mf->IssueMessage(MessageType::FATAL_ERROR,
                       "multiple values for CMAKE_OSX_ARCHITECTURES not "
                       "supported with Swift");
      cmSystemTools::SetFatalErrorOccurred();
      return false;
    }
  }
  return true;
}